

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O3

void __thiscall Jupiter::SecureTCPSocket::~SecureTCPSocket(SecureTCPSocket *this)

{
  SecureSocket::~SecureSocket(&this->super_SecureSocket);
  operator_delete(this,0x18);
  return;
}

Assistant:

class JUPITER_API SecureTCPSocket : public SecureSocket
	{
	public:
		SecureTCPSocket &operator=(SecureTCPSocket &&source);
		SecureTCPSocket();
		SecureTCPSocket(const SecureTCPSocket &) = delete;
		SecureTCPSocket(size_t bufferSize);
		SecureTCPSocket(Jupiter::Socket &&source);
		SecureTCPSocket(Jupiter::SecureSocket &&source);
	}